

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseUDP.h
# Opt level: O3

void __thiscall tonk::UDPSocket::~UDPSocket(UDPSocket *this)

{
  raw_node *prVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  raw_node *prVar3;
  
  (this->super_IUDPSender)._vptr_IUDPSender = (_func_int **)&PTR__UDPSocket_001b77a0;
  LOCK();
  ActiveUDPSocketCount = ActiveUDPSocketCount + -1;
  UNLOCK();
  prVar1 = (this->FloodDetect).CountMap.m_values;
  if (prVar1 != (raw_node *)0x0) {
    operator_delete__(prVar1[-1].m_bits + 0x1c);
  }
  p_Var2 = (this->AsioConnectStrand).
           super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  std::
  unique_ptr<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>,_std::default_delete<asio::basic_datagram_socket<asio::ip::udp,_asio::datagram_socket_service<asio::ip::udp>_>_>_>
  ::~unique_ptr(&this->Socket);
  p_Var2 = (this->Deps).Context.super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  (this->AddressMap)._vptr_ConnectionAddrMap = (_func_int **)&PTR__ConnectionAddrMap_001b7628;
  prVar3 = (this->AddressMap).AddressMap.TheMap.m_values;
  if (prVar3 != (raw_node *)0x0) {
    operator_delete__(prVar3[-1].m_bits + 0x28);
  }
  operator_delete(this);
  return;
}

Assistant:

TONK_FORCE_INLINE virtual ~UDPSocket()
    {
        ActiveUDPSocketCount--;
    }